

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_unk50(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_unk50_entry *peVar1;
  envy_bios_power_unk50 *peVar2;
  envy_bios_power_unk50_entry *e;
  int i;
  envy_bios_power_unk50 *unk50;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar2 = &(bios->power).unk50;
  if ((peVar2->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).unk50.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse THERMAL POLICY table at 0x%x, version %x\n",
              (ulong)peVar2->offset,(ulong)(bios->power).unk50.version);
    }
    else {
      fprintf((FILE *)out,"THERMAL POLICY table at 0x%x, version %x\n",(ulong)peVar2->offset,
              (ulong)(bios->power).unk50.version);
      envy_bios_dump_hex(bios,out,peVar2->offset,(uint)(bios->power).unk50.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (e._4_4_ = 0; (int)e._4_4_ < (int)(uint)(bios->power).unk50.entriesnum;
          e._4_4_ = e._4_4_ + 1) {
        peVar1 = (bios->power).unk50.entries;
        if (peVar1[(int)e._4_4_].mode == '\x01') {
          fprintf((FILE *)out,anon_var_dwarf_4a55c,(double)peVar1[(int)e._4_4_].t0 * 0.03125,
                  (double)peVar1[(int)e._4_4_].t1 * 0.03125,
                  (double)peVar1[(int)e._4_4_].t2 * 0.03125,(ulong)e._4_4_,
                  (ulong)peVar1[(int)e._4_4_].mode,(ulong)peVar1[(int)e._4_4_].interval_us);
          fprintf((FILE *)out,anon_var_dwarf_4a573,
                  (double)(int)peVar1[(int)e._4_4_].down_off * 0.03125);
          fprintf((FILE *)out,anon_var_dwarf_4a57e,(double)(int)peVar1[(int)e._4_4_].up_off / 32.0);
        }
        envy_bios_dump_hex(bios,out,(bios->power).unk50.entries[(int)e._4_4_].offset,
                           (uint)(bios->power).unk50.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_unk50(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk50 *unk50 = &bios->power.unk50;
	int i;

	if (!unk50->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk50->valid) {
		fprintf(out, "Failed to parse THERMAL POLICY table at 0x%x, version %x\n", unk50->offset, unk50->version);
		return;
	}

	fprintf(out, "THERMAL POLICY table at 0x%x, version %x\n", unk50->offset, unk50->version);
	envy_bios_dump_hex(bios, out, unk50->offset, unk50->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk50->entriesnum; i++) {
		struct envy_bios_power_unk50_entry *e = &unk50->entries[i];

		switch (e->mode) {
		case 1:
			fprintf(out, "%i: mode %i, t0 %.2f °C, t1 %.2f °C, t2 %.2f °C, interval %i ms\n",
				i, e->mode, (double)e->t0 / 32, (double)e->t1 / 32, (double)e->t2 / 32, e->interval_us);
			fprintf(out, "    downclock offset: %.2f °C\n", (double)e->down_off / 32);
			fprintf(out, "      upclock offset: %.2f °C\n", (double)e->up_off / 32);
			break;
		}

		envy_bios_dump_hex(bios, out, unk50->entries[i].offset, unk50->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}